

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errhandl.c
# Opt level: O3

void WriteLASErrDescr(FILE *File)

{
  size_t __size;
  char *__ptr;
  
  if (LASErrId == LASOK) {
    return;
  }
  if (LASProcName != (char *)0x0) {
    fprintf((FILE *)File,"in %s");
    if ((((LASObject1Name == (char *)0x0) && (LASObject2Name == (char *)0x0)) &&
        (LASObject3Name == (char *)0x0)) ||
       (fwrite(" for ",5,1,(FILE *)File), LASObject1Name == (char *)0x0)) {
      if (LASObject2Name != (char *)0x0) goto LAB_0011035f;
      if (LASObject3Name != (char *)0x0) goto LAB_0011039f;
    }
    else {
      fputs(LASObject1Name,(FILE *)File);
      if (LASObject2Name != (char *)0x0) {
        fwrite(", ",2,1,(FILE *)File);
LAB_0011035f:
        fputs(LASObject2Name,(FILE *)File);
      }
      if (LASObject3Name != (char *)0x0) {
        fwrite(", ",2,1,(FILE *)File);
LAB_0011039f:
        fputs(LASObject3Name,(FILE *)File);
      }
    }
    fputc(0x3a,(FILE *)File);
  }
  fputc(10,(FILE *)File);
  switch(LASErrId) {
  case LASMemAllocErr:
    __ptr = "Not enough memory is available.\n";
    goto LAB_00110456;
  case LASLValErr:
    __ptr = "L-value parameter is expected.\n";
    __size = 0x1f;
    break;
  case LASDimErr:
    __ptr = "Objects have incompatible dimensions.\n";
    __size = 0x26;
    break;
  case LASRangeErr:
    __ptr = "Indices are out of range.\n";
    __size = 0x1a;
    break;
  case LASSymStorErr:
    fwrite("Some elements are stored in lower triangular part",0x31,1,(FILE *)File);
    __ptr = " of a symmetric matrix.\n";
    goto LAB_00110412;
  case LASMatrCombErr:
    __ptr = "Matrices can not be combined.\n";
    goto LAB_00110472;
  case LASMulInvErr:
    __ptr = "Inverse multiplication can not be carried out.\n";
    __size = 0x2f;
    break;
  case LASElNotSortedErr:
    __ptr = "Matrix elements are not sorted.\n";
LAB_00110456:
    __size = 0x20;
    break;
  case LASZeroInDiagErr:
    __ptr = "Zero elements in matrix diagonal are not allowed.\n";
    __size = 0x32;
    break;
  case LASZeroPivotErr:
    __ptr = "Factorization produces zero pivot elements.\n";
    __size = 0x2c;
    break;
  case LASILUStructErr:
    __ptr = "Matrix has structure which is not allowed for ILU factorization.\n";
    __size = 0x41;
    break;
  case LASBreakdownErr:
    __ptr = "Iterative solver fails.\n";
LAB_00110412:
    __size = 0x18;
    break;
  case LASUserBreak:
    __ptr = "Termination by an user break.\n";
LAB_00110472:
    __size = 0x1e;
    break;
  default:
    return;
  }
  fwrite(__ptr,__size,1,(FILE *)File);
  return;
}

Assistant:

void WriteLASErrDescr(FILE *File)
/* write a short description of the reason caused break of LASPack */
{
    int NoPrintedObj;
    
    if (LASErrId != LASOK) {
	if (LASProcName != NULL) {
            fprintf(File, "in %s", LASProcName);
	    NoPrintedObj = 0;
	    if (LASObject1Name != NULL || LASObject2Name != NULL
		|| LASObject3Name != NULL)
                fprintf(File, " for ");
	    if (LASObject1Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject1Name);
		NoPrintedObj++;
	    }
	    if (LASObject2Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject2Name);
		NoPrintedObj++;
	    }
	    if (LASObject3Name != NULL) {
	        if (NoPrintedObj > 0)
                    fprintf(File, ", ");
                fprintf(File, "%s", LASObject3Name);
		NoPrintedObj++;
	    }
            fprintf(File, ":");
        }
        fprintf(File, "\n");
    }
    
    switch (LASErrId) {
        case LASOK:
            break;
        case LASMemAllocErr:
	    fprintf(File, "Not enough memory is available.\n");
            break;
        case LASLValErr:
	    fprintf(File, "L-value parameter is expected.\n");
            break;
        case LASDimErr:
	    fprintf(File, "Objects have incompatible dimensions.\n");
            break;
        case LASRangeErr:
	    fprintf(File, "Indices are out of range.\n");
            break;
        case LASSymStorErr:
	    fprintf(File, "Some elements are stored in lower triangular part");
	    fprintf(File, " of a symmetric matrix.\n");
            break;
        case LASMatrCombErr:
	    fprintf(File, "Matrices can not be combined.\n");
            break;
        case LASMulInvErr:
	    fprintf(File, "Inverse multiplication can not be carried out.\n");
            break;
        case LASElNotSortedErr:
	    fprintf(File, "Matrix elements are not sorted.\n");
            break;
        case LASZeroInDiagErr:
	    fprintf(File, "Zero elements in matrix diagonal are not allowed.\n");
            break;
        case LASZeroPivotErr:
	    fprintf(File, "Factorization produces zero pivot elements.\n");
            break;
        case LASILUStructErr:
	    fprintf(File, "Matrix has structure which is not allowed for ILU factorization.\n");
            break;
        case LASBreakdownErr:
	    fprintf(File, "Iterative solver fails.\n");
            break;
        case LASUserBreak:
	    fprintf(File, "Termination by an user break.\n");
            break;
    }
}